

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::FatalConditionHandler::reset(void)

{
  ulong local_10;
  size_t i;
  
  if ((isSet & 1) != 0) {
    for (local_10 = 0; local_10 < 6; local_10 = local_10 + 1) {
      sigaction(*(int *)(signalDefs + local_10 * 0x10),
                (sigaction *)(oldSigActions + local_10 * 0x98),(sigaction *)0x0);
    }
    sigaltstack((sigaltstack *)oldSigStack,(sigaltstack *)0x0);
    isSet = 0;
  }
  return;
}

Assistant:

static void reset() {
            if( isSet ) {
                // Set signals back to previous values -- hopefully nobody overwrote them in the meantime
                for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i ) {
                    sigaction(signalDefs[i].id, &oldSigActions[i], CATCH_NULL);
                }
                // Return the old stack
                sigaltstack(&oldSigStack, CATCH_NULL);
                isSet = false;
            }
        }